

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O0

void __thiscall cmGlobalGenerator::DirectoryContent::DirectoryContent(DirectoryContent *this)

{
  DirectoryContent *this_local;
  
  this->LastDiskTime = -1;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->All);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->Generated);
  return;
}

Assistant:

DirectoryContent()
      : LastDiskTime(-1)
    {
    }